

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.c
# Opt level: O2

int convolution_segment_set(uint32_t field,void *value,mixed_segment *segment)

{
  float fVar1;
  convolution_segment_data *data;
  int iVar2;
  code *pcVar3;
  uint32_t size;
  float *fir;
  
  if (field == 1) {
    pcVar3 = convolution_segment_mix;
    if (*value != '\0') {
      pcVar3 = convolution_segment_mix_bypass;
    }
LAB_00134a88:
    segment->mix = pcVar3;
    return 1;
  }
  data = (convolution_segment_data *)segment->data;
  if (field == 0x3c) {
    size = 0xffffffff;
    mixed_buffer_request_read(&fir,&size,(mixed_buffer *)value);
    iVar2 = update_fir(fir,size,data);
    return iVar2;
  }
  if (field == 0x29) {
    fVar1 = *value;
    if ((0.0 <= fVar1) && (fVar1 <= 1.0)) {
      data->mix = fVar1;
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        pcVar3 = convolution_segment_mix;
      }
      else {
        pcVar3 = convolution_segment_mix_bypass;
      }
      goto LAB_00134a88;
    }
  }
  else {
    if (field != 2) {
      iVar2 = 7;
      goto LAB_00134a97;
    }
    if (*value != 0) {
      data->samplerate = *value;
      free_fft_window_data(&data->fft_window_data);
      iVar2 = make_fft_window_data(data->block_size,4,data->samplerate,&data->fft_window_data);
      if (iVar2 == 0) {
        return 0;
      }
      return 1;
    }
  }
  iVar2 = 8;
LAB_00134a97:
  mixed_err(iVar2);
  return 0;
}

Assistant:

int convolution_segment_set(uint32_t field, void *value, struct mixed_segment *segment){
  struct convolution_segment_data *data = (struct convolution_segment_data *)segment->data;
  switch(field){
  case MIXED_SAMPLERATE:
    if(*(uint32_t *)value <= 0){
      mixed_err(MIXED_INVALID_VALUE);
      return 0;
    }
    data->samplerate = *(uint32_t *)value;
    free_fft_window_data(&data->fft_window_data);
    if(!make_fft_window_data(data->block_size, 4, data->samplerate, &data->fft_window_data)){
      return 0;
    }
    break;
  case MIXED_FIR: {
    float *fir;
    uint32_t size = 0xFFFFFFFF;
    mixed_buffer_request_read(&fir, &size, (struct mixed_buffer *)value);
    return update_fir(fir, size, data);
    break;}
  case MIXED_MIX:
    if(*(float *)value < 0 || 1 < *(float *)value){
      mixed_err(MIXED_INVALID_VALUE);
      return 0;
    }
    data->mix = *(float *)value;
    if(data->mix == 0){
      bool bypass = 1;
      return convolution_segment_set(MIXED_BYPASS, &bypass, segment);
    }else{
      bool bypass = 0;
      return convolution_segment_set(MIXED_BYPASS, &bypass, segment);
    }
    break;
  case MIXED_BYPASS:
    if(*(bool *)value){
      segment->mix = convolution_segment_mix_bypass;
    }else{
      segment->mix = convolution_segment_mix;
    }
    break;
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
  return 1;
}